

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsessionparams.cpp
# Opt level: O0

void __thiscall jrtplib::RTPSessionParams::RTPSessionParams(RTPSessionParams *this)

{
  RTPTime local_18;
  RTPSessionParams *local_10;
  RTPSessionParams *this_local;
  
  local_10 = this;
  RTPTime::RTPTime(&this->mininterval,0,0);
  std::__cxx11::string::string((string *)&this->cname);
  this->usepollthread = false;
  this->m_needThreadSafety = false;
  this->maxpacksize = 0x578;
  this->receivemode = AcceptAll;
  this->acceptown = false;
  this->owntsunit = -1.0;
  this->resolvehostname = false;
  this->probationtype = ProbationStore;
  RTPTime::RTPTime(&local_18,5.0);
  (this->mininterval).m_t = local_18.m_t;
  this->sessionbandwidth = 10000.0;
  this->controlfrac = 0.05;
  this->senderfrac = 0.25;
  this->usehalfatstartup = true;
  this->immediatebye = true;
  this->SR_BYE = true;
  this->sendermultiplier = 2.0;
  this->generaltimeoutmultiplier = 5.0;
  this->byetimeoutmultiplier = 1.0;
  this->collisionmultiplier = 10.0;
  this->notemultiplier = 25.0;
  this->usepredefinedssrc = false;
  this->predefinedssrc = 0;
  return;
}

Assistant:

RTPSessionParams::RTPSessionParams() : mininterval(0,0)
{
#ifdef RTP_SUPPORT_THREAD
	usepollthread = true;
	m_needThreadSafety = true;
#else
	usepollthread = false;
	m_needThreadSafety = false;
#endif // RTP_SUPPORT_THREAD
	maxpacksize = RTP_DEFAULTPACKETSIZE;
	receivemode = RTPTransmitter::AcceptAll;
	acceptown = false;
	owntsunit = -1; // The user will have to set it to the correct value himself
	resolvehostname = false;
#ifdef RTP_SUPPORT_PROBATION
	probationtype = RTPSources::ProbationStore;
#endif // RTP_SUPPORT_PROBATION

	mininterval = RTPTime(RTCP_DEFAULTMININTERVAL);
	sessionbandwidth = RTP_DEFAULTSESSIONBANDWIDTH;
	controlfrac = RTCP_DEFAULTBANDWIDTHFRACTION;
	senderfrac = RTCP_DEFAULTSENDERFRACTION;
	usehalfatstartup = RTCP_DEFAULTHALFATSTARTUP;
	immediatebye = RTCP_DEFAULTIMMEDIATEBYE;
	SR_BYE = RTCP_DEFAULTSRBYE;

	sendermultiplier = RTP_SENDERTIMEOUTMULTIPLIER;
	generaltimeoutmultiplier = RTP_MEMBERTIMEOUTMULTIPLIER;
	byetimeoutmultiplier = RTP_BYETIMEOUTMULTIPLIER;
	collisionmultiplier = RTP_COLLISIONTIMEOUTMULTIPLIER;
	notemultiplier = RTP_NOTETTIMEOUTMULTIPLIER;
	
	usepredefinedssrc = false;
	predefinedssrc = 0;
}